

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_xsaddqp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xa,
                   ppc_vsr_t *xb)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  float128 fVar4;
  uintptr_t unaff_retaddr;
  float_status local_60;
  uint64_t local_58;
  float_status local_50;
  float_status tstat;
  ppc_vsr_t t;
  ppc_vsr_t *xb_local;
  ppc_vsr_t *xa_local;
  ppc_vsr_t *xt_local;
  uint32_t opcode_local;
  CPUPPCState_conflict *env_local;
  
  tstat = (float_status)xt->u64[0];
  helper_reset_fpstatus(env);
  local_50 = env->fp_status;
  uVar1 = Rc(opcode);
  if (uVar1 != 0) {
    local_50.float_rounding_mode = '\x05';
  }
  set_float_exception_flags(0,&local_50);
  fVar4 = float128_add_ppc(xa->f128,xb->f128,&local_50);
  local_60 = (float_status)fVar4.low;
  tstat = local_60;
  local_58 = fVar4.high;
  (env->fp_status).float_exception_flags =
       (env->fp_status).float_exception_flags | local_50.float_exception_flags;
  if (((ulong)local_50 & 0x10000) != 0) {
    uVar2 = float128_classify(xa->f128);
    uVar3 = float128_classify(xb->f128);
    float_invalid_op_addsub(env,true,unaff_retaddr,uVar2 | uVar3);
  }
  fVar4.high = local_58;
  fVar4.low._0_1_ = tstat.float_detect_tininess;
  fVar4.low._1_1_ = tstat.float_rounding_mode;
  fVar4.low._2_1_ = tstat.float_exception_flags;
  fVar4.low._3_1_ = tstat.floatx80_rounding_precision;
  fVar4.low._4_1_ = tstat.flush_to_zero;
  fVar4.low._5_1_ = tstat.flush_inputs_to_zero;
  fVar4.low._6_1_ = tstat.default_nan_mode;
  fVar4.low._7_1_ = tstat.snan_bit_is_one;
  helper_compute_fprf_float128(env,fVar4);
  xt->u64[0] = (uint64_t)tstat;
  xt->u64[1] = local_58;
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xsaddqp(CPUPPCState *env, uint32_t opcode,
                    ppc_vsr_t *xt, ppc_vsr_t *xa, ppc_vsr_t *xb)
{
    ppc_vsr_t t = *xt;
    float_status tstat;

    helper_reset_fpstatus(env);

    tstat = env->fp_status;
    if (unlikely(Rc(opcode) != 0)) {
        tstat.float_rounding_mode = float_round_to_odd;
    }

    set_float_exception_flags(0, &tstat);
    t.f128 = float128_add(xa->f128, xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        float_invalid_op_addsub(env, 1, GETPC(),
                                float128_classify(xa->f128) |
                                float128_classify(xb->f128));
    }

    helper_compute_fprf_float128(env, t.f128);

    *xt = t;
    do_float_check_status(env, GETPC());
}